

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void stable_grail_common_sort(int **arr,int Len,int **extbuf,int LExtBuf)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  size_t size;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int **ppiVar15;
  int **ppiVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  undefined8 *puVar26;
  ulong uVar27;
  int iVar28;
  int *piVar29;
  int **ppiVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  int **arr_00;
  int iVar38;
  ulong uVar39;
  int **ppiVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  int iVar46;
  uint uVar47;
  int **ppiVar48;
  int **ppiVar49;
  long lVar50;
  int local_194;
  int local_f0;
  int **local_90;
  int **local_88;
  
  if (Len < 0x11) {
    stable_bitonic_sort(arr,(long)Len);
    return;
  }
  uVar5 = 1;
  do {
    uVar6 = uVar5;
    uVar22 = (ulong)uVar6;
    uVar5 = uVar6 * 2;
  } while ((int)(uVar6 * uVar6) < Len);
  iVar10 = (Len + -1) / (int)uVar6;
  iVar17 = iVar10 + uVar6 + 1;
  if (iVar17 < 2) {
    iVar46 = 1;
    iVar28 = 0;
  }
  else {
    iVar28 = 0;
    iVar46 = 1;
    uVar44 = 1;
    do {
      iVar19 = iVar46;
      if (0 < iVar46) {
        iVar18 = -1;
        do {
          iVar24 = (iVar19 - iVar18 >> 1) + iVar18;
          if (*arr[uVar44] <= *(arr + iVar28)[iVar24]) {
            iVar19 = iVar24;
            iVar24 = iVar18;
          }
          iVar18 = iVar24;
        } while (iVar18 < iVar19 + -1);
      }
      if ((iVar46 - iVar19 == 0) || (*arr[uVar44] != *arr[iVar28 + iVar19])) {
        stable_grail_rotate(arr + iVar28,iVar46,(int)uVar44 - (iVar28 + iVar46));
        iVar28 = (int)uVar44 - iVar46;
        stable_grail_rotate(arr + (iVar19 + iVar28),iVar46 - iVar19,1);
        iVar46 = iVar46 + 1;
      }
      uVar44 = uVar44 + 1;
    } while ((uVar44 < (uint)Len) && (iVar46 < iVar17));
  }
  stable_grail_rotate(arr,iVar28,iVar46);
  if (iVar46 < iVar17) {
    if (iVar46 < 4) {
      uVar22 = 1;
      do {
        piVar29 = arr[uVar22 - 1];
        if (*arr[uVar22] < *piVar29) {
          arr[uVar22 - 1] = arr[uVar22];
          arr[uVar22] = piVar29;
        }
        uVar22 = uVar22 + 2;
      } while (uVar22 < (uint)Len);
      iVar10 = 2;
      do {
        iVar17 = iVar10 * 2;
        uVar5 = Len + iVar10 * -2;
        lVar45 = 0;
        if (-1 < (int)uVar5) {
          lVar45 = 0;
          ppiVar48 = arr;
          do {
            stable_grail_merge_without_buffer(ppiVar48,iVar10,iVar10);
            lVar45 = lVar45 + iVar17;
            ppiVar48 = ppiVar48 + iVar17;
          } while (lVar45 <= (long)(ulong)uVar5);
        }
        iVar28 = Len - (int)lVar45;
        iVar46 = iVar28 - iVar10;
        if (iVar46 != 0 && iVar10 <= iVar28) {
          stable_grail_merge_without_buffer(arr + (int)lVar45,iVar10,iVar46);
        }
        iVar10 = iVar17;
      } while (iVar17 < Len);
      return;
    }
    do {
      uVar23 = uVar22;
      uVar22 = (ulong)((uint)uVar23 >> 1);
    } while (iVar46 < (int)(uint)uVar23);
    uVar22 = 0;
    uVar44 = uVar23;
  }
  else {
    uVar23 = (ulong)(iVar10 + 1);
    uVar44 = uVar22;
  }
  iVar19 = (int)uVar23;
  iVar28 = (int)uVar22 + iVar19;
  uVar5 = Len - iVar28;
  size = (size_t)iVar28;
  ppiVar48 = arr + size;
  iVar18 = (int)uVar44;
  ppiVar49 = extbuf;
  iVar10 = LExtBuf;
  if (iVar46 < iVar17) {
    ppiVar49 = (int **)0x0;
    iVar10 = 0;
  }
  stable_grail_build_blocks(ppiVar48,uVar5,iVar18,ppiVar49,iVar10);
  uVar6 = iVar18 * 2;
  if (uVar5 != uVar6 && SBORROW4(uVar5,uVar6) == (int)(uVar5 + iVar18 * -2) < 0) {
    do {
      uVar12 = uVar22;
      if ((iVar46 < iVar17) &&
         ((iVar19 < 5 || (uVar12 = uVar23 >> 1, (int)(uVar23 >> 3) * iVar19 < (int)uVar6)))) {
        iVar10 = 1;
        if ((1 < iVar19) && ((long)(int)uVar6 * (long)iVar46 != 0)) {
          lVar45 = (long)(int)uVar6 * (long)iVar46 >> 1;
          do {
            iVar10 = iVar10 * 2;
            lVar50 = lVar45 + 7;
            if (-1 < lVar45) {
              lVar50 = lVar45;
            }
          } while ((iVar10 < iVar19) &&
                  (uVar12 = lVar45 - 8, lVar45 = lVar50 >> 3, uVar12 < 0xfffffffffffffff1));
        }
        uVar12 = (long)((int)uVar44 * 4) / (long)iVar10 & 0xffffffff;
        bVar3 = true;
        bVar4 = false;
      }
      else {
        bVar4 = true;
        bVar3 = false;
      }
      uVar11 = (uint)uVar12;
      ppiVar49 = extbuf;
      if (LExtBuf < (int)uVar11) {
        ppiVar49 = (int **)0x0;
      }
      if (bVar3) {
        ppiVar49 = (int **)0x0;
      }
      iVar38 = (int)uVar44 * 4;
      uVar44 = (long)(int)uVar5 / (long)iVar38 & 0xffffffff;
      iVar10 = (int)uVar5 % iVar38;
      iVar24 = iVar10;
      iVar18 = 0;
      if ((int)uVar6 < iVar10) {
        iVar24 = 0;
        iVar18 = iVar10;
      }
      lVar45 = (long)(int)uVar11;
      if (ppiVar49 != (int **)0x0) {
        memcpy(ppiVar49,ppiVar48 + -lVar45,lVar45 * 8);
      }
      local_f0 = (int)((long)(int)uVar5 / (long)iVar38);
      if (-1 < local_f0) {
        iVar10 = 0;
        uVar27 = 0;
        do {
          if ((iVar18 == 0) && (uVar27 == uVar44)) break;
          lVar50 = (long)iVar10;
          arr_00 = ppiVar48 + iVar38 * (int)uVar27;
          iVar21 = iVar38;
          if (uVar27 == uVar44) {
            iVar21 = iVar18;
          }
          uVar14 = (long)iVar21 / (long)(int)uVar11;
          iVar21 = (int)uVar14;
          uVar34 = uVar14 & 0xffffffff;
          stable_bitonic_sort(arr,(long)(int)((uint)(uVar27 == uVar44) + iVar21));
          uVar33 = (long)(int)uVar6 / (long)(int)uVar11 & 0xffffffff;
          iVar20 = (int)((long)(int)uVar6 / (long)(int)uVar11);
          if (1 < iVar21) {
            lVar13 = size + lVar45 + lVar50;
            ppiVar16 = ppiVar48 + lVar50;
            uVar37 = 1;
            do {
              uVar43 = uVar37 - 1;
              uVar39 = uVar43 & 0xffffffff;
              lVar41 = lVar13;
              uVar42 = uVar37;
              do {
                if ((*arr[lVar41] < *arr_00[(int)((int)uVar39 * uVar11)]) ||
                   ((*arr_00[(int)((int)uVar39 * uVar11)] == *arr[lVar41] &&
                    (*arr[uVar42] < *arr[(int)uVar39])))) {
                  uVar39 = uVar42 & 0xffffffff;
                }
                uVar42 = uVar42 + 1;
                lVar41 = lVar41 + lVar45;
              } while (uVar34 != uVar42);
              uVar7 = (uint)uVar39;
              if (uVar43 != uVar39) {
                if (uVar11 != 0) {
                  lVar41 = 0;
                  do {
                    piVar29 = ppiVar16[lVar41];
                    ppiVar16[lVar41] = ppiVar48[lVar50 + (int)(uVar7 * uVar11) + lVar41];
                    ppiVar48[lVar50 + (int)(uVar7 * uVar11) + lVar41] = piVar29;
                    lVar41 = lVar41 + 1;
                  } while (uVar11 != (uint)lVar41);
                }
                piVar29 = arr[uVar37 - 1];
                arr[uVar37 - 1] = arr[(int)uVar7];
                arr[(int)uVar7] = piVar29;
                if (uVar43 == uVar33 || (uint)uVar33 == uVar7) {
                  uVar33 = (ulong)((uint)uVar33 ^ (uint)uVar43 ^ uVar7);
                }
              }
              iVar20 = (int)uVar33;
              uVar37 = uVar37 + 1;
              lVar13 = lVar13 + lVar45;
              ppiVar16 = ppiVar16 + lVar45;
            } while (uVar37 != uVar34);
          }
          iVar31 = 0;
          local_194 = 0;
          if (uVar27 == uVar44) {
            local_194 = iVar18 % (int)uVar11;
          }
          if ((0 < iVar21) && (local_194 != 0)) {
            puVar26 = (undefined8 *)((long)ppiVar48 + (uVar34 - 1) * lVar45 * 8 + lVar50 * 8);
            uVar33 = 0;
            do {
              if (*(int *)*puVar26 <= *arr_00[(int)(iVar21 * uVar11)]) goto LAB_00112ceb;
              uVar33 = uVar33 + 1;
              puVar26 = puVar26 + -lVar45;
            } while (uVar34 != uVar33);
            uVar33 = uVar14 & 0xffffffff;
LAB_00112ceb:
            iVar31 = (int)uVar33;
          }
          ppiVar16 = arr + size + lVar50;
          uVar7 = iVar21 - iVar31;
          if (ppiVar49 == (int **)0x0) {
            if (iVar21 == iVar31) {
              iVar31 = iVar31 * uVar11;
            }
            else {
              uVar8 = (uint)(*arr[iVar20] <= **arr);
              uVar14 = uVar12;
              uVar32 = uVar11;
              if (1 < (int)uVar7) {
                local_88 = ppiVar48 + lVar45 + lVar50;
                local_90 = arr + size + lVar45 + lVar50 + -1;
                uVar37 = 1;
                uVar33 = uVar12;
                uVar34 = uVar12;
                do {
                  iVar21 = (int)uVar34;
                  uVar32 = uVar8;
                  if (uVar8 == *arr[iVar20] <= *arr[uVar37]) {
                    uVar14 = uVar12;
                    if (iVar21 != 0 && !bVar3) {
                      lVar13 = (long)iVar21;
                      lVar41 = 0;
                      do {
                        piVar29 = ppiVar16[lVar41 - lVar13];
                        ppiVar16[lVar41 - lVar13] = local_88[lVar41 - lVar13];
                        local_88[lVar41 - lVar13] = piVar29;
                        lVar41 = lVar41 + 1;
                      } while (iVar21 != (int)lVar41);
                    }
                  }
                  else {
                    ppiVar15 = arr_00 + ((int)uVar33 - iVar21);
                    if (bVar3) {
                      uVar14 = uVar34;
                      if (((uVar11 != 0) &&
                          (uVar47 = 1 - uVar8, uVar14 = uVar12, uVar32 = uVar47, iVar21 != 0)) &&
                         (uVar43 = uVar12,
                         -1 < (int)((*ppiVar15[(long)iVar21 + -1] + (uVar8 - 1)) - *ppiVar15[iVar21]
                                   ))) {
                        while( true ) {
                          iVar25 = (int)uVar34;
                          lVar13 = (long)iVar25;
                          iVar35 = (int)uVar43;
                          iVar21 = iVar35;
                          if (uVar8 == 1) {
                            if (0 < iVar35) {
                              uVar14 = uVar43;
                              uVar32 = 0xffffffff;
                              do {
                                uVar36 = ((int)((int)uVar14 - uVar32) >> 1) + uVar32;
                                if (**ppiVar15 < *ppiVar15[lVar13 + (int)uVar36]) {
                                  uVar14 = (ulong)uVar36;
                                  uVar36 = uVar32;
                                }
                                iVar21 = (int)uVar14;
                                uVar32 = uVar36;
                              } while ((int)uVar36 < iVar21 + -1);
                            }
                          }
                          else if (0 < iVar35) {
                            uVar32 = 0xffffffff;
                            uVar14 = uVar43;
                            do {
                              uVar36 = ((int)((int)uVar14 - uVar32) >> 1) + uVar32;
                              if (**ppiVar15 <= *ppiVar15[lVar13 + (int)uVar36]) {
                                uVar14 = (ulong)uVar36;
                                uVar36 = uVar32;
                              }
                              uVar32 = uVar36;
                              iVar21 = (int)uVar14;
                            } while ((int)uVar32 < iVar21 + -1);
                          }
                          if (iVar21 != 0) {
                            stable_grail_rotate(ppiVar15,iVar25,iVar21);
                            ppiVar15 = ppiVar15 + iVar21;
                            uVar43 = (ulong)(uint)(iVar35 - iVar21);
                          }
                          uVar14 = uVar34;
                          uVar32 = uVar8;
                          if ((int)uVar43 == 0) break;
                          lVar41 = 0;
                          ppiVar30 = ppiVar15;
                          do {
                            uVar14 = uVar43;
                            uVar32 = uVar47;
                            if (lVar13 + -1 == lVar41) goto LAB_001132d0;
                            ppiVar40 = ppiVar30 + 1;
                            ppiVar30 = ppiVar30 + 1;
                            lVar41 = lVar41 + 1;
                          } while ((int)((**ppiVar40 + (uVar8 - 1)) - *ppiVar15[lVar13]) < 0);
                          uVar34 = (ulong)(uint)(iVar25 - (int)lVar41);
                          ppiVar15 = ppiVar30;
                        }
                      }
                    }
                    else {
                      iVar9 = iVar21 + uVar11;
                      bVar2 = 0 < iVar21;
                      iVar35 = 0;
                      iVar25 = iVar21;
                      if ((0 < (int)uVar11) && (iVar35 = 0, 0 < iVar21)) {
                        ppiVar30 = ppiVar16 + -(long)iVar21;
                        iVar35 = 0;
                        do {
                          lVar13 = (long)iVar35;
                          piVar29 = ppiVar15[lVar13];
                          iVar25 = (int)uVar34;
                          if ((int)((*piVar29 + (uVar8 - 1)) - *ppiVar15[iVar25]) < 0) {
                            iVar35 = iVar35 + 1;
                          }
                          else {
                            uVar34 = (ulong)(iVar25 + 1);
                            piVar29 = ppiVar15[iVar25];
                            lVar13 = (long)iVar25;
                          }
                          iVar25 = (int)uVar34;
                          piVar1 = *ppiVar30;
                          *ppiVar30 = piVar29;
                          ppiVar15[lVar13] = piVar1;
                          bVar2 = iVar35 < iVar21;
                        } while ((iVar35 < iVar21) && (ppiVar30 = ppiVar30 + 1, iVar25 < iVar9));
                      }
                      if (bVar2) {
                        uVar8 = iVar21 - iVar35;
                        uVar14 = (ulong)uVar8;
                        if (uVar8 != 0 && iVar35 <= iVar21) {
                          lVar41 = (long)iVar21;
                          lVar13 = lVar41;
                          ppiVar15 = local_90;
                          do {
                            lVar13 = lVar13 + -1;
                            piVar29 = *ppiVar15;
                            *ppiVar15 = ppiVar15[iVar9 - lVar41];
                            ppiVar15[iVar9 - lVar41] = piVar29;
                            ppiVar15 = ppiVar15 + -1;
                          } while (iVar35 < lVar13);
                        }
                      }
                      else {
                        uVar14 = (ulong)(uint)(iVar9 - iVar25);
                        uVar32 = 1 - uVar8;
                      }
                    }
                  }
LAB_001132d0:
                  uVar8 = uVar32;
                  uVar37 = uVar37 + 1;
                  uVar32 = (int)uVar33 + uVar11;
                  uVar33 = (ulong)uVar32;
                  ppiVar16 = ppiVar16 + lVar45;
                  local_90 = local_90 + lVar45;
                  local_88 = local_88 + lVar45;
                  uVar34 = uVar14;
                } while (uVar37 != uVar7);
              }
              iVar21 = (int)uVar14;
              uVar7 = uVar32 - iVar21;
              if (local_194 == 0) {
                if (iVar21 != 0 && !bVar3) {
                  lVar13 = 0;
                  do {
                    piVar29 = ppiVar48[((long)(int)uVar32 + lVar50 + lVar13) - (long)iVar21];
                    ppiVar48[((long)(int)uVar32 + lVar50 + lVar13) - (long)iVar21] =
                         ppiVar48[((long)(int)uVar7 + lVar50 + lVar13) - lVar45];
                    ppiVar48[((long)(int)uVar7 + lVar50 + lVar13) - lVar45] = piVar29;
                    lVar13 = lVar13 + 1;
                  } while (iVar21 != (int)lVar13);
                }
                goto LAB_0011349e;
              }
              if (uVar8 == 0) {
                iVar31 = iVar21 + iVar31 * uVar11;
              }
              else {
                if (iVar21 != 0 && !bVar3) {
                  ppiVar16 = arr_00 + (int)uVar7;
                  do {
                    piVar29 = ppiVar16[-lVar45];
                    ppiVar16[-lVar45] = *ppiVar16;
                    *ppiVar16 = piVar29;
                    ppiVar16 = ppiVar16 + 1;
                    uVar7 = (int)uVar14 - 1;
                    uVar14 = (ulong)uVar7;
                  } while (uVar7 != 0);
                }
                iVar31 = iVar31 * uVar11;
                uVar7 = uVar32;
              }
              arr_00 = arr_00 + (int)uVar7;
            }
            if (bVar3) {
              stable_grail_merge_without_buffer(arr_00,iVar31,local_194);
            }
            else {
              stable_grail_merge_left(arr_00,iVar31,local_194,-uVar11);
            }
          }
          else {
            if (iVar21 == iVar31) {
              iVar31 = iVar31 * uVar11;
            }
            else {
              uVar8 = (uint)(*arr[iVar20] <= **arr);
              uVar32 = uVar11;
              uVar47 = uVar11;
              if (1 < (int)uVar7) {
                ppiVar15 = arr + size + lVar45 + lVar50 + -1;
                uVar34 = 1;
                uVar14 = uVar12;
                uVar33 = uVar12;
                do {
                  uVar32 = (uint)uVar14;
                  ppiVar30 = arr_00 + (int)((int)uVar33 - uVar32);
                  if (uVar8 == *arr[iVar20] <= *arr[uVar34]) {
                    memcpy(ppiVar30 + -lVar45,ppiVar30,(long)(int)uVar32 << 3);
                    uVar14 = uVar12;
                  }
                  else {
                    iVar21 = uVar32 + uVar11;
                    bVar2 = 0 < (int)uVar32;
                    uVar36 = 0;
                    uVar47 = uVar32;
                    if ((0 < (int)uVar11) && (0 < (int)uVar32)) {
                      ppiVar40 = ppiVar16 + -(long)(int)uVar32;
                      uVar37 = 0;
                      do {
                        iVar35 = (*ppiVar30[uVar37] + (uVar8 - 1)) - *ppiVar30[uVar14];
                        piVar29 = ppiVar30[uVar37];
                        if (-1 < iVar35) {
                          piVar29 = ppiVar30[uVar14];
                        }
                        uVar36 = (int)uVar37 - (iVar35 >> 0x1f);
                        uVar37 = (ulong)uVar36;
                        uVar47 = (uint)(-1 < iVar35) + (int)uVar14;
                        uVar14 = (ulong)uVar47;
                        *ppiVar40 = piVar29;
                        bVar2 = (int)uVar36 < (int)uVar32;
                      } while (((int)uVar36 < (int)uVar32) &&
                              (ppiVar40 = ppiVar40 + 1, (int)uVar47 < iVar21));
                    }
                    if (bVar2) {
                      uVar14 = (ulong)(uVar32 - uVar36);
                      if (uVar32 - uVar36 != 0 && (int)uVar36 <= (int)uVar32) {
                        lVar50 = (long)(int)uVar32;
                        ppiVar30 = ppiVar15;
                        do {
                          lVar50 = lVar50 + -1;
                          ppiVar30[(long)iVar21 - (long)(int)uVar32] = *ppiVar30;
                          ppiVar30 = ppiVar30 + -1;
                        } while ((int)uVar36 < lVar50);
                      }
                    }
                    else {
                      uVar8 = 1 - uVar8;
                      uVar14 = (ulong)(iVar21 - uVar47);
                    }
                  }
                  uVar34 = uVar34 + 1;
                  uVar47 = (int)uVar33 + uVar11;
                  uVar33 = (ulong)uVar47;
                  ppiVar16 = ppiVar16 + lVar45;
                  ppiVar15 = ppiVar15 + lVar45;
                  uVar32 = (uint)uVar14;
                } while (uVar34 != uVar7);
              }
              uVar7 = uVar47 - uVar32;
              if (local_194 == 0) {
                memcpy(arr_00 + (int)uVar7 + -lVar45,arr_00 + (int)uVar7,(long)(int)uVar32 << 3);
                goto LAB_0011349e;
              }
              if (uVar8 == 0) {
                iVar31 = uVar32 + iVar31 * uVar11;
              }
              else {
                memcpy(arr_00 + (int)uVar7 + -lVar45,arr_00 + (int)uVar7,(long)(int)uVar32 << 3);
                iVar31 = iVar31 * uVar11;
                uVar7 = uVar47;
              }
              arr_00 = arr_00 + (int)uVar7;
            }
            stable_grail_merge_left_with_x_buf(arr_00,iVar31,local_194,-uVar11);
          }
LAB_0011349e:
          uVar27 = uVar27 + 1;
          iVar10 = iVar10 + iVar38;
        } while (uVar27 != local_f0 + 1);
      }
      uVar11 = uVar5 - iVar24;
      if (ppiVar49 == (int **)0x0) {
        if (bVar4 && 0 < (int)uVar11) {
          uVar44 = (ulong)uVar11;
          iVar24 = (uVar5 + 1) - iVar24;
          do {
            uVar44 = uVar44 - 1;
            ppiVar49 = ppiVar48 + (uVar44 & 0xffffffff);
            piVar29 = *ppiVar49;
            *ppiVar49 = ppiVar49[-lVar45];
            ppiVar49[-lVar45] = piVar29;
            iVar24 = iVar24 + -1;
          } while (1 < iVar24);
        }
      }
      else {
        if (0 < (int)uVar11) {
          lVar50 = (ulong)uVar11 + 1;
          do {
            ppiVar48[lVar50 + -2] = ppiVar48[(lVar50 + -2) - lVar45];
            lVar50 = lVar50 + -1;
          } while (1 < lVar50);
        }
        memcpy(ppiVar48 + -lVar45,ppiVar49,lVar45 * 8);
      }
      uVar11 = uVar6 * 2;
      iVar10 = uVar6 * -2;
      uVar44 = (ulong)uVar6;
      uVar6 = uVar11;
    } while (uVar5 != uVar11 && SBORROW4(uVar5,uVar11) == (int)(uVar5 + iVar10) < 0);
  }
  stable_bitonic_sort(arr,size);
  stable_grail_merge_without_buffer(arr,iVar28,uVar5);
  return;
}

Assistant:

static void GRAIL_COMMON_SORT(SORT_TYPE *arr, int Len, SORT_TYPE *extbuf,
                              int LExtBuf) {
  int lblock, nkeys, findkeys, ptr, cbuf, lb, nk;
  int havebuf, chavebuf;
  long long s;

  if (Len <= SMALL_SORT_BND) {
    SMALL_SORT(arr, Len);
    return;
  }

  lblock = 1;

  while (lblock * lblock < Len) {
    lblock *= 2;
  }

  nkeys = (Len - 1) / lblock + 1;
  findkeys = GRAIL_FIND_KEYS(arr, Len, nkeys + lblock);
  havebuf = 1;

  if (findkeys < nkeys + lblock) {
    if (findkeys < 4) {
      GRAIL_LAZY_STABLE_SORT(arr, Len);
      return;
    }

    nkeys = lblock;

    while (nkeys > findkeys) {
      nkeys /= 2;
    }

    havebuf = 0;
    lblock = 0;
  }

  ptr = lblock + nkeys;
  cbuf = havebuf ? lblock : nkeys;

  if (havebuf) {
    GRAIL_BUILD_BLOCKS(arr + ptr, Len - ptr, cbuf, extbuf, LExtBuf);
  } else {
    GRAIL_BUILD_BLOCKS(arr + ptr, Len - ptr, cbuf, NULL, 0);
  }

  /* 2*cbuf are built */
  while (Len - ptr > (cbuf *= 2)) {
    lb = lblock;
    chavebuf = havebuf;

    if (!havebuf) {
      if (nkeys > 4 && nkeys / 8 * nkeys >= cbuf) {
        lb = nkeys / 2;
        chavebuf = 1;
      } else {
        nk = 1;
        s = (long long)cbuf * findkeys / 2;

        while (nk < nkeys && s != 0) {
          nk *= 2;
          s /= 8;
        }

        lb = (2 * cbuf) / nk;
      }
    }

    GRAIL_COMBINE_BLOCKS(arr, arr + ptr, Len - ptr, cbuf, lb, chavebuf,
                         chavebuf && lb <= LExtBuf ? extbuf : NULL);
  }

  SMALL_SORT(arr, ptr);
  GRAIL_MERGE_WITHOUT_BUFFER(arr, ptr, Len - ptr);
}